

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPCollisionList::UpdateAddress
          (RTPCollisionList *this,RTPAddress *addr,RTPTime *receivetime,bool *created)

{
  list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
  *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  _List_node_base *p_Var4;
  value_type local_40;
  
  if (addr == (RTPAddress *)0x0) {
    return -3;
  }
  this_00 = &this->addresslist;
  p_Var4 = (_List_node_base *)this_00;
  do {
    p_Var4 = (((_List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)this_00) {
      iVar3 = (**addr->_vptr_RTPAddress)(addr,(this->super_RTPMemoryObject).mgr);
      local_40.addr = (RTPAddress *)CONCAT44(extraout_var,iVar3);
      if (local_40.addr == (RTPAddress *)0x0) {
        return -1;
      }
      local_40.recvtime = (RTPTime)receivetime->m_t;
      std::__cxx11::
      list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
      ::push_back(this_00,&local_40);
      bVar2 = true;
      goto LAB_00131768;
    }
    cVar1 = (**(code **)(*(long *)p_Var4[1]._M_next + 8))(p_Var4[1]._M_next,addr);
  } while (cVar1 == '\0');
  p_Var4[1]._M_prev = (_List_node_base *)receivetime->m_t;
  bVar2 = false;
LAB_00131768:
  *created = bVar2;
  return 0;
}

Assistant:

int RTPCollisionList::UpdateAddress(const RTPAddress *addr,const RTPTime &receivetime,bool *created)
{
	if (addr == 0)
		return ERR_RTP_COLLISIONLIST_BADADDRESS;
	
	std::list<AddressAndTime>::iterator it;
	
	for (it = addresslist.begin() ; it != addresslist.end() ; it++)
	{
		if (((*it).addr)->IsSameAddress(addr))
		{
			(*it).recvtime = receivetime;
			*created = false;
			return 0;
		}
	}

	RTPAddress *newaddr = addr->CreateCopy(GetMemoryManager());
	if (newaddr == 0)
		return ERR_RTP_OUTOFMEM;
	
	addresslist.push_back(AddressAndTime(newaddr,receivetime));
	*created = true;
	return 0;
}